

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istream.cc
# Opt level: O0

double __thiscall wabt::interp::Istream::ReadAt<double>(Istream *this,Offset *offset)

{
  uint uVar1;
  double dVar2;
  size_type sVar3;
  uchar *puVar4;
  double result;
  Offset *offset_local;
  Istream *this_local;
  
  uVar1 = *offset;
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data_);
  if ((ulong)uVar1 + 8 <= sVar3) {
    puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->data_);
    dVar2 = *(double *)(puVar4 + *offset);
    *offset = *offset + 8;
    return dVar2;
  }
  __assert_fail("*offset + sizeof(T) <= data_.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/istream.cc"
                ,0x6f,"T wabt::interp::Istream::ReadAt(Offset *) const [T = double]");
}

Assistant:

T WABT_VECTORCALL Istream::ReadAt(Offset* offset) const {
  assert(*offset + sizeof(T) <= data_.size());
  T result;
  memcpy(&result, data_.data() + *offset, sizeof(T));
  *offset += sizeof(T);
  return result;
}